

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t setup_suitable_read_buffer(archive_read_disk *a)

{
  _func_int_archive_ptr_int *p_Var1;
  void *pvVar2;
  archive *in_RDI;
  long incr;
  long xfer_align;
  size_t s;
  size_t asize;
  filesystem *cf;
  tree *t;
  ulong local_48;
  ulong local_40;
  ulong local_30;
  size_t local_28;
  
  p_Var1 = in_RDI[1].vtable[4].archive_filter_code;
  if (*(long *)(p_Var1 + 0x40) == 0) {
    if (*(long *)(p_Var1 + 0x38) == -1) {
      local_48 = 0x1000;
    }
    else {
      local_48 = *(ulong *)(p_Var1 + 0x38);
    }
    if (*(long *)(p_Var1 + 0x28) == -1) {
      local_40 = *(ulong *)(p_Var1 + 0x20);
      if ((long)local_40 < 0) {
        local_40 = *(ulong *)(p_Var1 + 0x30);
      }
      if (*(long *)(p_Var1 + 0x30) < 0) {
        local_40 = local_48;
        local_28 = local_48;
      }
      else {
        local_28 = *(size_t *)(p_Var1 + 0x30);
      }
      for (; local_28 < 0x10000; local_28 = local_40 + local_28) {
      }
    }
    else {
      local_28 = *(size_t *)(p_Var1 + 0x28);
    }
    local_28 = local_28 + local_48;
    pvVar2 = malloc(local_28);
    *(void **)(p_Var1 + 0x40) = pvVar2;
    if (*(long *)(p_Var1 + 0x40) == 0) {
      archive_set_error(in_RDI,0xc,"Couldn\'t allocate memory");
      in_RDI->state = 0x8000;
      return L'\xffffffe2';
    }
    local_30 = *(ulong *)(p_Var1 + 0x40) % local_48;
    if (local_30 != 0) {
      local_30 = local_48 - local_30;
    }
    *(ulong *)(p_Var1 + 0x48) = *(long *)(p_Var1 + 0x40) + local_30;
    *(size_t *)(p_Var1 + 0x50) = local_28 - local_48;
  }
  return L'\0';
}

Assistant:

static int
setup_suitable_read_buffer(struct archive_read_disk *a)
{
	struct tree *t = a->tree;
	struct filesystem *cf = t->current_filesystem;
	size_t asize;
	size_t s;

	if (cf->allocation_ptr == NULL) {
		/* If we couldn't get a filesystem alignment,
		 * we use 4096 as default value but we won't use
		 * O_DIRECT to open() and openat() operations. */
		long xfer_align = (cf->xfer_align == -1)?4096:cf->xfer_align;

		if (cf->max_xfer_size != -1)
			asize = cf->max_xfer_size + xfer_align;
		else {
			long incr = cf->incr_xfer_size;
			/* Some platform does not set a proper value to
			 * incr_xfer_size.*/
			if (incr < 0)
				incr = cf->min_xfer_size;
			if (cf->min_xfer_size < 0) {
				incr = xfer_align;
				asize = xfer_align;
			} else
				asize = cf->min_xfer_size;

			/* Increase a buffer size up to 64K bytes in
			 * a proper incremant size. */
			while (asize < 1024*64)
				asize += incr;
			/* Take a margin to adjust to the filesystem
			 * alignment. */
			asize += xfer_align;
		}
		cf->allocation_ptr = malloc(asize);
		if (cf->allocation_ptr == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't allocate memory");
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}

		/*
		 * Calculate proper address for the filesystem.
		 */
		s = (uintptr_t)cf->allocation_ptr;
		s %= xfer_align;
		if (s > 0)
			s = xfer_align - s;

		/*
		 * Set a read buffer pointer in the proper alignment of
		 * the current filesystem.
		 */
		cf->buff = cf->allocation_ptr + s;
		cf->buff_size = asize - xfer_align;
	}
	return (ARCHIVE_OK);
}